

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O3

string * __thiscall
t_markdown_generator::escape_html
          (string *__return_storage_ptr__,t_markdown_generator *this,string *str)

{
  byte bVar1;
  string *psVar2;
  input_type iVar3;
  ulong uVar4;
  ostream *poVar5;
  undefined8 *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong firstpos;
  ostringstream result;
  string local_1d0;
  string *local_1b0;
  undefined1 local_1a8 [376];
  
  local_1b0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  uVar4 = str->_M_string_length;
  if (uVar4 != 0) {
    firstpos = 0;
    do {
      uVar7 = firstpos + 1;
      uVar8 = firstpos;
      if (firstpos + 1 < uVar4) {
        uVar7 = uVar4;
      }
      do {
        bVar1 = (str->_M_dataplus)._M_p[uVar8];
        uVar9 = uVar8;
        if ((char)bVar1 < ' ') break;
        uVar8 = uVar8 + 1;
        uVar9 = uVar7;
      } while (uVar7 != uVar8);
      if (firstpos < uVar9) {
        std::__cxx11::string::substr((ulong)&local_1d0,(ulong)str);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   (char *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,
                                    local_1d0._M_dataplus._M_p._0_1_),local_1d0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_) !=
            &local_1d0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_
                                  ));
        }
        uVar4 = str->_M_string_length;
        firstpos = uVar9;
      }
      if (uVar4 <= firstpos) break;
      if (bVar1 < 0x20) {
        if ((bVar1 < 0xe) && ((0x2600U >> (bVar1 & 0x1f) & 1) != 0)) {
          local_1d0._M_dataplus._M_p._0_1_ = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)&local_1d0,1);
        }
      }
      else {
        iVar3 = this->input_type_;
        if (iVar3 == INPUT_UNKNOWN) {
          detect_input_encoding(this,str,firstpos);
          iVar3 = this->input_type_;
          if (iVar3 == INPUT_UTF8) {
            std::__cxx11::string::substr((ulong)&local_1d0,(ulong)str);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       (char *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,
                                        local_1d0._M_dataplus._M_p._0_1_),local_1d0._M_string_length
                      );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_) !=
                &local_1d0.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_1d0._M_dataplus._M_p._1_7_,
                                       local_1d0._M_dataplus._M_p._0_1_));
            }
            break;
          }
        }
        if (iVar3 != INPUT_PLAIN) {
          puVar6 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar6 = "Unexpected or unrecognized input encoding";
          __cxa_throw(puVar6,&char_const*::typeinfo,0);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"&#",2);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
      }
      firstpos = firstpos + 1;
      uVar4 = str->_M_string_length;
    } while (firstpos < uVar4);
  }
  std::__cxx11::stringbuf::str();
  psVar2 = local_1b0;
  escape_html_tags(local_1b0,this,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_) !=
      &local_1d0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar2;
}

Assistant:

std::string t_markdown_generator::escape_html(std::string const& str) {
  // the generated HTML header says it is UTF-8 encoded
  // if UTF-8 input has been detected before, we don't need to change anything
  //if (input_type_ == INPUT_UTF8) {
  //  return escape_html_tags(str);
  //}

  // convert unsafe chars to their &#<num>; equivalent
  std::ostringstream result;
  unsigned char c = '?';
  unsigned int ic = 0;
  size_t lastpos;
  size_t firstpos = 0;
  while (firstpos < str.length()) {

    // look for non-ASCII char
    lastpos = firstpos;
    while (lastpos < str.length()) {
      c = str.at(lastpos);
      ic = c;
      if ((32 > ic) || (127 < ic)) {
        break;
      }
      ++lastpos;
    }

    // copy what we got so far
    if (lastpos > firstpos) {
      result << str.substr(firstpos, lastpos - firstpos);
      firstpos = lastpos;
    }

    // reached the end?
    if (firstpos >= str.length()) {
      break;
    }

    // some control code?
    if (ic <= 31) {
      switch (c) {
      case '\r':
      case '\n':
      case '\t':
        result << ' ';
        break;
      default: // silently consume all other ctrl chars
        break;
      }
      ++firstpos;
      continue;
    }

    // reached the end?
    if (firstpos >= str.length()) {
      break;
    }

    // try to detect input encoding
    if (input_type_ == INPUT_UNKNOWN) {
      detect_input_encoding(str, firstpos);
      if (input_type_ == INPUT_UTF8) {
        lastpos = str.length();
        result << str.substr(firstpos, lastpos - firstpos);
        break;
      }
    }

    // convert the character to something useful based on the detected encoding
    switch (input_type_) {
    case INPUT_PLAIN:
      result << "&#" << ic << ";";
      ++firstpos;
      break;
    default:
      throw "Unexpected or unrecognized input encoding";
    }
  }

  return escape_html_tags(result.str());
}